

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall ccs::ParserImpl::parseRule(ParserImpl *this,Nested *ast)

{
  __single_object this_00;
  bool bVar1;
  pointer pNVar2;
  type pNVar3;
  parse_error *ppVar4;
  unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> local_398;
  undefined1 local_389;
  Location local_388;
  string local_380;
  ostringstream local_360 [8];
  ostringstream _message_1;
  string local_1d8;
  ostringstream local_1b8 [8];
  ostringstream _message;
  undefined1 local_30 [24];
  __single_object nested;
  Nested *ast_local;
  ParserImpl *this_local;
  
  nested._M_t.super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>._M_t.
  super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>.
  super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl =
       (__uniq_ptr_data<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>,_true,_true>)
       (__uniq_ptr_data<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>,_true,_true>)ast;
  bVar1 = parsePrimRule(this,ast);
  if (bVar1) {
    advanceIf(this,SEMI);
  }
  else {
    std::make_unique<ccs::ast::Nested>();
    parseSelector((ParserImpl *)local_30);
    pNVar2 = std::unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>::operator->
                       ((unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_> *)
                        (local_30 + 0x10));
    std::shared_ptr<ccs::ast::SelectorBranch>::operator=
              (&pNVar2->selector_,(shared_ptr<ccs::ast::SelectorBranch> *)local_30);
    std::shared_ptr<ccs::ast::SelectorBranch>::~shared_ptr
              ((shared_ptr<ccs::ast::SelectorBranch> *)local_30);
    bVar1 = advanceIf(this,COLON);
    if (bVar1) {
      pNVar3 = std::unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>::operator*
                         ((unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_> *)
                          (local_30 + 0x10));
      bVar1 = parsePrimRule(this,pNVar3);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_1b8);
        std::operator<<((ostream *)local_1b8,"Expected @import, @constrain, or property setting");
        ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        anon_unknown_0::parse_error::parse_error(ppVar4,&local_1d8,(this->cur_).location);
        __cxa_throw(ppVar4,&(anonymous_namespace)::parse_error::typeinfo,
                    anon_unknown_0::parse_error::~parse_error);
      }
      advanceIf(this,SEMI);
    }
    else {
      bVar1 = advanceIf(this,LBRACE);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_360);
        std::operator<<((ostream *)local_360,"Expected \':\' or \'{\' following selector");
        local_389 = 1;
        ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        local_388 = (this->cur_).location;
        anon_unknown_0::parse_error::parse_error(ppVar4,&local_380,local_388);
        local_389 = 0;
        __cxa_throw(ppVar4,&(anonymous_namespace)::parse_error::typeinfo,
                    anon_unknown_0::parse_error::~parse_error);
      }
      while (bVar1 = advanceIf(this,RBRACE), ((bVar1 ^ 0xffU) & 1) != 0) {
        pNVar3 = std::unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>::
                 operator*((unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_> *)
                           (local_30 + 0x10));
        parseRule(this,pNVar3);
      }
    }
    this_00._M_t.super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>.
    _M_t.super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>.
    super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl =
         nested._M_t.super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>
         ._M_t.super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>.
         super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl;
    std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>::
    unique_ptr<ccs::ast::Nested,std::default_delete<ccs::ast::Nested>,void>
              ((unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>> *)&local_398,
               (unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_> *)
               (local_30 + 0x10));
    ccs::ast::Nested::addRule
              ((Nested *)
               this_00._M_t.
               super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>._M_t.
               super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>.
               super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl,&local_398);
    std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>::~unique_ptr
              (&local_398);
    std::unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>::~unique_ptr
              ((unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_> *)
               (local_30 + 0x10));
  }
  return;
}

Assistant:

void parseRule(ast::Nested &ast) {
    // the only ambiguity is between ident as start of a property setting
    // and ident as start of a selector, i.e.:
    //   foo = bar
    //   foo : bar = 'baz'
    // we can use the presence of '=' to disambiguate. parsePrimRule() performs
    // this lookahead without consuming the additional token.
    if (parsePrimRule(ast)) {
      advanceIf(Token::SEMI);
      return;
    }

    auto nested = std::make_unique<ast::Nested>();
    nested->selector_ = parseSelector();

    if (advanceIf(Token::COLON)) {
      if (!parsePrimRule(*nested))
        THROW(cur_.location,
            "Expected @import, @constrain, or property setting");
      advanceIf(Token::SEMI);
    } else if (advanceIf(Token::LBRACE)) {
      while (!advanceIf(Token::RBRACE)) parseRule(*nested);
    } else {
      THROW(cur_.location, "Expected ':' or '{' following selector");
    }

    ast.addRule(std::move(nested));
  }